

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::reservedPpErrorCheck
          (TParseContext *this,TSourceLoc *loc,char *identifier,char *op)

{
  EProfile EVar1;
  int iVar2;
  char *pcVar3;
  _func_int **pp_Var4;
  
  if ((((*identifier == 'G') && (identifier[1] == 'L')) && (identifier[2] == '_')) &&
     (iVar2 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                        (this,"GL_EXT_spirv_intrinsics"), (char)iVar2 == '\0')) {
    pp_Var4 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions + 0x2f;
    pcVar3 = "names beginning with \"GL_\" can\'t be (un)defined:";
  }
  else {
    iVar2 = strncmp(identifier,"defined",8);
    if (iVar2 == 0) {
      pp_Var4 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      if (((this->super_TParseContextBase).super_TParseVersions.messages & EShMsgRelaxedErrors) ==
          EShMsgDefault) {
        pp_Var4 = pp_Var4 + 0x2f;
        pcVar3 = "\"defined\" can\'t be (un)defined:";
      }
      else {
        pp_Var4 = pp_Var4 + 0x30;
        pcVar3 = "\"defined\" is (un)defined:";
      }
    }
    else {
      pcVar3 = strstr(identifier,"__");
      if (pcVar3 == (char *)0x0) {
        return;
      }
      iVar2 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                        (this,"GL_EXT_spirv_intrinsics");
      if ((char)iVar2 != '\0') {
        return;
      }
      EVar1 = (this->super_TParseContextBase).super_TParseVersions.profile;
      iVar2 = (this->super_TParseContextBase).super_TParseVersions.version;
      if (iVar2 < 300 || EVar1 != EEsProfile) {
        if ((iVar2 < 300 && EVar1 == EEsProfile) &&
           (((this->super_TParseContextBase).super_TParseVersions.messages & EShMsgRelaxedErrors) ==
            EShMsgDefault)) {
          pp_Var4 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions + 0x2f
          ;
          pcVar3 = 
          "names containing consecutive underscores are reserved, and an error if version < 300:";
          goto LAB_00417809;
        }
      }
      else {
        iVar2 = strcmp(identifier,"__LINE__");
        if (((iVar2 == 0) || (iVar2 = strcmp(identifier,"__FILE__"), iVar2 == 0)) ||
           (iVar2 = strcmp(identifier,"__VERSION__"), iVar2 == 0)) {
          pp_Var4 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions + 0x2f
          ;
          pcVar3 = "predefined names can\'t be (un)defined:";
          goto LAB_00417809;
        }
      }
      pp_Var4 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions + 0x30;
      pcVar3 = "names containing consecutive underscores are reserved:";
    }
  }
LAB_00417809:
  (**pp_Var4)(this,loc,pcVar3,op,identifier,*pp_Var4);
  return;
}

Assistant:

void TParseContext::reservedPpErrorCheck(const TSourceLoc& loc, const char* identifier, const char* op)
{
    // "__" are not supposed to be an error.  ES 300 (and desktop) added the clarification:
    // "All macro names containing two consecutive underscores ( __ ) are reserved;
    // defining such a name does not itself result in an error, but may result in
    // undefined behavior.  All macro names prefixed with "GL_" ("GL" followed by a
    // single underscore) are also reserved, and defining such a name results in a
    // compile-time error."
    // however, before that, ES tests required an error.
    if (strncmp(identifier, "GL_", 3) == 0 && !extensionTurnedOn(E_GL_EXT_spirv_intrinsics))
        // The extension GL_EXT_spirv_intrinsics allows us to declare macros prefixed with "GL_".
        ppError(loc, "names beginning with \"GL_\" can't be (un)defined:", op,  identifier);
    else if (strncmp(identifier, "defined", 8) == 0)
        if (relaxedErrors())
            ppWarn(loc, "\"defined\" is (un)defined:", op,  identifier);
        else
            ppError(loc, "\"defined\" can't be (un)defined:", op,  identifier);
    else if (strstr(identifier, "__") != nullptr && !extensionTurnedOn(E_GL_EXT_spirv_intrinsics)) {
        // The extension GL_EXT_spirv_intrinsics allows us to declare macros prefixed with "__".
        if (isEsProfile() && version >= 300 &&
            (strcmp(identifier, "__LINE__") == 0 ||
             strcmp(identifier, "__FILE__") == 0 ||
             strcmp(identifier, "__VERSION__") == 0))
            ppError(loc, "predefined names can't be (un)defined:", op,  identifier);
        else {
            if (isEsProfile() && version < 300 && !relaxedErrors())
                ppError(loc, "names containing consecutive underscores are reserved, and an error if version < 300:", op, identifier);
            else
                ppWarn(loc, "names containing consecutive underscores are reserved:", op, identifier);
        }
    }
}